

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall osqp::anon_unknown_0::TwoDimensionalQpTest::SetUp(TwoDimensionalQpTest *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_3a0;
  AssertHelper local_380;
  Message local_378;
  Status local_370;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_;
  OsqpSettings settings;
  Scalar local_290;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_288;
  Scalar local_268;
  Scalar local_260;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_258;
  undefined1 local_238 [8];
  OsqpInstance instance;
  Triplet<double,_int> *local_170;
  double local_168;
  int local_160 [2];
  undefined1 local_158 [8];
  Triplet<double,_int> kTripletsA [1];
  undefined1 local_140 [8];
  SparseMatrix<double,_0,_int> constraint_matrix;
  Triplet<double,_int> *local_f0;
  double local_e8;
  int local_e0 [2];
  double local_d8;
  int local_d0 [2];
  double local_c8;
  int local_bc [5];
  double local_a8;
  int local_a0 [2];
  undefined1 local_98 [8];
  Triplet<double,_int> kTripletsP [4];
  SparseMatrix<double,_0,_int> objective_matrix;
  TwoDimensionalQpTest *this_local;
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&kTripletsP[3].m_value,2,2);
  local_a0[1] = 0;
  local_a0[0] = 0;
  local_a8 = 2.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)local_98,local_a0 + 1,local_a0,&local_a8);
  local_bc[1] = 1;
  local_bc[0] = 0;
  local_c8 = 0.5;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsP[0].m_value,local_bc + 1,local_bc,&local_c8);
  local_d0[1] = 0;
  local_d0[0] = 1;
  local_d8 = 0.5;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsP[1].m_value,local_d0 + 1,local_d0,&local_d8);
  local_e0[1] = 1;
  local_e0[0] = 1;
  local_e8 = 2.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsP[2].m_value,local_e0 + 1,local_e0,&local_e8);
  local_f0 = std::begin<Eigen::Triplet<double,int>const,4ul>((Triplet<double,_int> (*) [4])local_98)
  ;
  constraint_matrix.m_data.m_allocatedSize =
       (Index)std::end<Eigen::Triplet<double,int>const,4ul>((Triplet<double,_int> (*) [4])local_98);
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)&kTripletsP[3].m_value,&local_f0,
             (Triplet<double,_int> **)&constraint_matrix.m_data.m_allocatedSize);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix((SparseMatrix<double,_0,_int> *)local_140,1,2);
  local_160[1] = 0;
  local_160[0] = 0;
  local_168 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)local_158,local_160 + 1,local_160,&local_168);
  local_170 = std::begin<Eigen::Triplet<double,int>const,1ul>
                        ((Triplet<double,_int> (*) [1])local_158);
  instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = (Index)std::end<Eigen::Triplet<double,int>const,1ul>
                            ((Triplet<double,_int> (*) [1])local_158);
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)local_140,&local_170,
             (Triplet<double,_int> **)
             &instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  OsqpInstance::OsqpInstance((OsqpInstance *)local_238);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_238,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&kTripletsP[3].m_value);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,2);
  local_260 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_258,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,&local_260);
  local_268 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_258,&local_268)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_258);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)
             &instance.objective_vector.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_140);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,1);
  local_290 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_288,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,&local_290);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_288);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&settings.time_limit,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,(Scalar *)&(anonymous_namespace)::kInfinity);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&settings.time_limit);
  OsqpSettings::OsqpSettings((OsqpSettings *)&gtest_ar_.message_);
  settings.max_iter = 0x3eb0c6f7a0b5ed8e;
  settings.eps_abs = 0.0;
  settings.verbose = true;
  settings.scaled_termination = false;
  settings._130_6_ = 0;
  OsqpSolver::Init((OsqpSolver *)&local_370,(OsqpInstance *)&this->solver_,(OsqpSettings *)local_238
                  );
  local_361 = absl::Status::ok(&local_370);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  absl::Status::~Status(&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)local_360,
               (AssertionResult *)"solver_.Init(instance, settings).ok()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x145,message);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  OsqpInstance::~OsqpInstance((OsqpInstance *)local_238);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_140);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&kTripletsP[3].m_value);
  return;
}

Assistant:

void SetUp() override {
    // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
    SparseMatrix<double> objective_matrix(2, 2);
    const Triplet<double> kTripletsP[] = {
        {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 2.0}};
    objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                     std::end(kTripletsP));

    SparseMatrix<double> constraint_matrix(1, 2);
    const Triplet<double> kTripletsA[] = {{0, 0, 1.0}};
    constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                      std::end(kTripletsA));

    OsqpInstance instance;
    instance.objective_matrix = objective_matrix;
    instance.objective_vector.resize(2);
    instance.objective_vector << 0.0, 0.0;
    instance.constraint_matrix = constraint_matrix;
    instance.lower_bounds.resize(1);
    instance.lower_bounds << 1.0;
    instance.upper_bounds.resize(1);
    instance.upper_bounds << kInfinity;

    OsqpSettings settings;
    settings.eps_abs = kTolerance / 10;
    settings.eps_rel = 0.0;
    // check_termination is set so that the warm-started instance converges
    // immediately.
    settings.check_termination = 1;
    ASSERT_TRUE(solver_.Init(instance, settings).ok());
  }